

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLastInternal<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (void *param_1)

{
  Arena *pAVar1;
  Type *new_result;
  Arena *arena;
  Type *result;
  RepeatedPtrFieldBase *in_stack_00000030;
  string *in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  local_8 = UnsafeArenaReleaseLast<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                      (in_stack_00000030);
  pAVar1 = GetArena((RepeatedPtrFieldBase *)param_1);
  if (pAVar1 != (Arena *)0x0) {
    local_8 = StringTypeHandler::NewFromPrototype(in_stack_ffffffffffffffd0,(Arena *)param_1);
    StringTypeHandler::Merge(local_8,(string *)param_1);
  }
  return local_8;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::ReleaseLastInternal(
    std::true_type) {
  // First, release an element.
  typename TypeHandler::Type* result = UnsafeArenaReleaseLast<TypeHandler>();
  // Now perform a copy if we're on an arena.
  Arena* arena = GetArena();
  if (arena == NULL) {
    return result;
  } else {
    typename TypeHandler::Type* new_result =
        TypeHandler::NewFromPrototype(result, NULL);
    TypeHandler::Merge(*result, new_result);
    return new_result;
  }
}